

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

void assert_version_id(char **qq,size_t *ss)

{
  bool bVar1;
  size_t local_28;
  size_t s;
  char *q;
  size_t *ss_local;
  char **qq_local;
  
  s = (size_t)*qq;
  local_28 = *ss;
  while( true ) {
    bVar1 = false;
    if (((local_28 != 0) && (bVar1 = true, *(char *)s != '.')) && (bVar1 = false, '/' < *(char *)s))
    {
      bVar1 = *(char *)s < ':';
    }
    if (!bVar1) break;
    s = s + 1;
    local_28 = local_28 - 1;
  }
  if (((*(char *)s == 'd') && (*(char *)(s + 1) == 'e')) && (*(char *)(s + 2) == 'v')) {
    s = s + 3;
    local_28 = local_28 - 3;
  }
  if (((*(char *)s == 'a') || (*(char *)s == 'b')) || ((*(char *)s == 'c' || (*(char *)s == 'd'))))
  {
    s = s + 1;
  }
  failure("No space after version: ``%s\'\'",s);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/test_utils/test_main.c"
                   ,L'ॕ',(uint)(1 < local_28),"s > 1",(void *)0x0);
  failure("No space after version: ``%s\'\'",s);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/test_utils/test_main.c"
                   ,L'ॗ',(uint)(*(char *)s == ' '),"*q == \' \'",(void *)0x0);
  *qq = (char *)(s + 1);
  *ss = local_28 - 1;
  return;
}

Assistant:

static void assert_version_id(char **qq, size_t *ss)
{
	char *q = *qq;
	size_t s = *ss;

	/* Version number is a series of digits and periods. */
	while (s > 0 && (*q == '.' || (*q >= '0' && *q <= '9'))) {
		++q;
		--s;
	}

	if (q[0] == 'd' && q[1] == 'e' && q[2] == 'v') {
		q += 3;
		s -= 3;
	}

	/* Skip a single trailing a,b,c, or d. */
	if (*q == 'a' || *q == 'b' || *q == 'c' || *q == 'd')
		++q;

	/* Version number terminated by space. */
	failure("No space after version: ``%s''", q);
	assert(s > 1);
	failure("No space after version: ``%s''", q);
	assert(*q == ' ');

	++q; --s;

	*qq = q;
	*ss = s;
}